

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_SETP(Context *ctx)

{
  int iVar1;
  char *pcVar2;
  size_t in_RCX;
  char *fmt;
  char *pcVar3;
  char src0 [64];
  char code [128];
  char src1 [64];
  
  iVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_GLSL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_GLSL_srcarg_string_masked(ctx,1,src1,in_RCX);
  if (iVar1 == 1) {
    pcVar2 = get_GLSL_comparison_string_scalar(ctx);
    fmt = "(%s %s %s)";
    pcVar3 = src0;
  }
  else {
    if ((ulong)ctx->instruction_controls < 7) {
      pcVar3 = get_GLSL_comparison_string_vector_comps_rel +
               *(int *)(get_GLSL_comparison_string_vector_comps_rel +
                       (ulong)ctx->instruction_controls * 4);
    }
    else {
      fail(ctx,"unknown comparison control");
      pcVar3 = "";
    }
    fmt = "%s(%s, %s)";
    pcVar2 = src0;
  }
  make_GLSL_destarg_assign(ctx,code,0x80,fmt,pcVar3,pcVar2,src1);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    if (vecsize == 1)
    {
        const char *comp = get_GLSL_comparison_string_scalar(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "(%s %s %s)", src0, comp, src1);
    } // if
    else
    {
        const char *comp = get_GLSL_comparison_string_vector(ctx);
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "%s(%s, %s)", comp, src0, src1);
    } // else

    output_line(ctx, "%s", code);
}